

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorProto::FileDescriptorProto
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  InternalMetadataWithArena *this_00;
  void *pvVar1;
  FileOptions *from_00;
  SourceCodeInfo *from_01;
  uint uVar2;
  FileOptions *this_01;
  SourceCodeInfo *this_02;
  Arena *pAVar3;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorProto_0064b3a0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  this_00 = &this->_internal_metadata_;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->dependency_,&from->dependency_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::RepeatedPtrField
            (&this->message_type_,&from->message_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::RepeatedPtrField
            (&this->enum_type_,&from->enum_type_);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::RepeatedPtrField
            (&this->service_,&from->service_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::RepeatedPtrField
            (&this->extension_,&from->extension_);
  RepeatedField<int>::RepeatedField(&this->public_dependency_,&from->public_dependency_);
  RepeatedField<int>::RepeatedField(&this->weak_dependency_,&from->weak_dependency_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    pAVar3 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->name_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->name_).ptr_,pAVar3);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->package_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 2) != 0) {
    pAVar3 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->package_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->package_).ptr_,pAVar3);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->syntax_).ptr_ = (string *)internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 4) != 0) {
    pAVar3 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar3 & 1) != 0) {
      pAVar3 = *(Arena **)(((ulong)pAVar3 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::Set
              (&this->syntax_,(string *)internal::fixed_address_empty_string_abi_cxx11_,
               (from->syntax_).ptr_,pAVar3);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 & 8) == 0) {
    this->options_ = (FileOptions *)0x0;
  }
  else {
    from_00 = from->options_;
    this_01 = (FileOptions *)operator_new(0xa8);
    FileOptions::FileOptions(this_01,from_00);
    this->options_ = this_01;
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  if ((uVar2 & 0x10) == 0) {
    this_02 = (SourceCodeInfo *)0x0;
  }
  else {
    from_01 = from->source_code_info_;
    this_02 = (SourceCodeInfo *)operator_new(0x30);
    SourceCodeInfo::SourceCodeInfo(this_02,from_01);
  }
  this->source_code_info_ = this_02;
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto(const FileDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      dependency_(from.dependency_),
      message_type_(from.message_type_),
      enum_type_(from.enum_type_),
      service_(from.service_),
      extension_(from.extension_),
      public_dependency_(from.public_dependency_),
      weak_dependency_(from.weak_dependency_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArenaNoVirtual());
  }
  package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_package()) {
    package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_package(),
      GetArenaNoVirtual());
  }
  syntax_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_syntax()) {
    syntax_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_syntax(),
      GetArenaNoVirtual());
  }
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::FileOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  if (from._internal_has_source_code_info()) {
    source_code_info_ = new PROTOBUF_NAMESPACE_ID::SourceCodeInfo(*from.source_code_info_);
  } else {
    source_code_info_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FileDescriptorProto)
}